

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.c
# Opt level: O0

err_t DummySkip(void *p,intptr_t *Skip)

{
  err_t local_458;
  long local_430;
  err_t Err;
  intptr_t n;
  size_t Readed;
  uint8_t Buf [1024];
  intptr_t *Skip_local;
  void *p_local;
  
  Err = *Skip;
  local_430 = 0;
  Buf._1016_8_ = Skip;
  while( true ) {
    if (Err < 1 || local_430 != 0) {
      *(err_t *)Buf._1016_8_ = Err;
      return local_430;
    }
    if (p == (void *)0x0) break;
    if (Err < 0x401) {
      local_458 = Err;
    }
    else {
      local_458 = 0x400;
    }
    local_430 = (**(code **)(*(long *)((long)p + 8) + 0x58))(p,&Readed,local_458,&n);
    Err = Err - n;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/streams.c"
                ,0x14,"err_t DummySkip(void *, intptr_t *)");
}

Assistant:

static err_t DummySkip(void* p, intptr_t* Skip)
{
    uint8_t Buf[1024];
    size_t Readed;
    intptr_t n = *Skip;
    err_t Err = ERR_NONE;
    while (n>0 && Err == ERR_NONE)
    {
        Err = Stream_Read(p,Buf,MIN(n,(intptr_t)sizeof(Buf)),&Readed);
        n -= Readed;
    }
    *Skip = n;
    return Err;
}